

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwlocxx.hpp
# Opt level: O3

void __thiscall hwlocxx::topology::topology(topology *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  hwloc_topology_t system;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  (this->topology_).super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->topology_).super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hwloc_topology_init();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<hwloc_topology*,hwlocxx::topology::topology()::_lambda(hwloc_topology*)_1_,std::allocator<void>,void>
            ();
  this_00 = (this->topology_).super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->topology_).super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->topology_).super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Stack_20;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  hwloc_topology_load((this->topology_).
                      super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

topology() : topology_{nullptr}
   {
      hwloc_topology_t system = nullptr;
      hwloc_topology_init(&system);
      topology_ = std::shared_ptr<hwloc_topology>{
          system, [=](hwloc_topology_t ptr) { hwloc_topology_destroy(ptr); }};
      hwloc_topology_load(topology_.get());
   }